

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileLangConstruct(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  int iVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  sxi32 sVar4;
  jx9_value *pObj;
  SyToken *pStart;
  sxu32 nIdx;
  SyToken *local_38;
  
  pSVar2 = pGen->pIn;
  iVar1 = *(int *)&pSVar2->pUserData;
  pGen->pIn = pSVar2 + 1;
  if (iVar1 == 2) {
    local_38 = (SyToken *)0x0;
    pSVar2 = pGen->pEnd;
    jx9VmEmitInstr(pGen->pVm,4,0,1,(void *)0x0,(sxu32 *)0x0);
    pStart = pGen->pIn;
    do {
      sVar3 = jx9GetNextExpr(pStart,pSVar2,&local_38);
      pStart = local_38;
      if (sVar3 != 0) {
        pGen->pEnd = pSVar2;
        return 0;
      }
      if (pGen->pIn < local_38) {
        pGen->pEnd = local_38;
        sVar3 = jx9CompileExpr(pGen,2,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
        if (sVar3 != -3) {
          if (sVar3 == -10) goto LAB_001268db;
          jx9VmEmitInstr(pGen->pVm,0x3e,1,0,(void *)0x0,(sxu32 *)0x0);
        }
      }
      for (; (pStart < pSVar2 && ((pStart->nType & 0x20000) != 0)); pStart = pStart + 1) {
      }
      pGen->pIn = pStart;
      local_38 = pStart;
    } while( true );
  }
  nIdx = 0;
  sVar3 = jx9CompileExpr(pGen,2,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
  if (sVar3 == -10) {
LAB_001268db:
    sVar4 = -10;
  }
  else {
    sVar4 = GenStateFindLiteral(pGen,&pSVar2->sData,&nIdx);
    if (sVar4 != 0) {
      pObj = jx9VmReserveConstObj(pGen->pVm,&nIdx);
      if (pObj == (jx9_value *)0x0) {
        GenStateOutOfMem(pGen);
        goto LAB_001268db;
      }
      jx9MemObjInitFromString(pGen->pVm,pObj,&pSVar2->sData);
      GenStateInstallLiteral(pGen,pObj,nIdx);
    }
    sVar4 = 0;
    jx9VmEmitInstr(pGen->pVm,4,0,nIdx,(void *)0x0,(sxu32 *)0x0);
    jx9VmEmitInstr(pGen->pVm,0x10,(uint)(sVar3 != -3),0,(void *)0x0,(sxu32 *)0x0);
  }
  return sVar4;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileLangConstruct(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyString *pName;
	sxu32 nKeyID;
	sxi32 rc;
	/* Name of the language construct [i.e: print, die...]*/
	pName = &pGen->pIn->sData;
	nKeyID = (sxu32)SX_PTR_TO_INT(pGen->pIn->pUserData);
	pGen->pIn++; /* Jump the language construct keyword */
	if( nKeyID == JX9_TKWRD_PRINT ){
		SyToken *pTmp, *pNext = 0;
		/* Compile arguments one after one */
		pTmp = pGen->pEnd;
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 1 /* Boolean true index */, 0, 0);
		while( SXRET_OK == jx9GetNextExpr(pGen->pIn, pTmp, &pNext) ){
			if( pGen->pIn < pNext ){
				pGen->pEnd = pNext;
				rc = jx9CompileExpr(&(*pGen), EXPR_FLAG_RDONLY_LOAD/* Do not create variable if inexistant */, 0);
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
				if( rc != SXERR_EMPTY ){
					/* Ticket 1433-008: Optimization #1: Consume input directly 
					 * without the overhead of a function call.
					 * This is a very powerful optimization that improve
					 * performance greatly.
					 */
					jx9VmEmitInstr(pGen->pVm,JX9_OP_CONSUME,1,0,0,0);
				}
			}
			/* Jump trailing commas */
			while( pNext < pTmp && (pNext->nType & JX9_TK_COMMA) ){
				pNext++;
			}
			pGen->pIn = pNext;
		}
		/* Restore token stream */
		pGen->pEnd = pTmp;	
	}else{
		sxi32 nArg = 0;
		sxu32 nIdx = 0;
		rc = jx9CompileExpr(&(*pGen), EXPR_FLAG_RDONLY_LOAD/* Do not create variable if inexistant */, 0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}else if(rc != SXERR_EMPTY ){
			nArg = 1;
		}
		if( SXRET_OK != GenStateFindLiteral(&(*pGen), pName, &nIdx) ){
			jx9_value *pObj;
			/* Emit the call instruction */
			pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
			if( pObj == 0 ){
				SXUNUSED(iCompileFlag); /* cc warning */
				return GenStateOutOfMem(pGen);
			}
			jx9MemObjInitFromString(pGen->pVm, pObj, pName);
			/* Install in the literal table */
			GenStateInstallLiteral(&(*pGen), pObj, nIdx);
		}
		/* Emit the call instruction */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
		jx9VmEmitInstr(pGen->pVm, JX9_OP_CALL, nArg, 0, 0, 0);
	}
	/* Node successfully compiled */
	return SXRET_OK;
}